

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile_unix.cpp
# Opt level: O2

void __thiscall QLockFile::unlock(QLockFile *this)

{
  QLockFilePrivate *t;
  int iVar1;
  QDebug *pQVar2;
  long in_FS_OFFSET;
  QDebug local_20;
  char *local_18;
  
  local_18 = *(char **)(in_FS_OFFSET + 0x28);
  t = (this->d_ptr).d;
  if (t->isLocked == true) {
    close(t->fileHandle);
    t->fileHandle = -1;
    iVar1 = QFile::remove((char *)t);
    if ((char)iVar1 == '\0') {
      QMessageLogger::warning((QMessageLogger *)&local_20);
      pQVar2 = QDebug::operator<<(&local_20,"Could not remove our own lock file");
      pQVar2 = QDebug::operator<<(pQVar2,&t->fileName);
      QDebug::operator<<(pQVar2,"maybe permissions changed meanwhile?");
      QDebug::~QDebug(&local_20);
    }
    t->lockError = NoError;
    t->isLocked = false;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLockFile::unlock()
{
    Q_D(QLockFile);
    if (!d->isLocked)
        return;
    close(d->fileHandle);
    d->fileHandle = -1;
    if (!QFile::remove(d->fileName)) {
        qWarning() << "Could not remove our own lock file" << d->fileName << "maybe permissions changed meanwhile?";
        // This is bad because other users of this lock file will now have to wait for the stale-lock-timeout...
    }
    d->lockError = QLockFile::NoError;
    d->isLocked = false;
}